

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O1

void __thiscall amrex::CoordSys::HiFace(CoordSys *this,IntVect *point,int dir,Real *loc)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    *(double *)((long)loc + lVar1 * 2) =
         ((double)*(int *)((long)point->vect + lVar1) +
         *(double *)(&DAT_007920c0 + (ulong)((ulong)(uint)dir << 2 == lVar1) * 8)) *
         *(double *)((long)this->dx + lVar1 * 2) + *(double *)((long)this->offset + lVar1 * 2);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

void
CoordSys::HiFace (const IntVect& point,
                  int            dir,
                  Real*          loc) const noexcept
{
    AMREX_ASSERT(ok);
    AMREX_ASSERT(loc != 0);
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        Real off = (k == dir) ? 1.0_rt : 0.5_rt;
        loc[k] = offset[k] + dx[k]*(off + (Real)point[k]);
    }
}